

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool __thiscall
testing::internal::DefaultDeathTestFactory::Create
          (DefaultDeathTestFactory *this,char *statement,
          Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
          *matcher,char *file,int line,DeathTest **test)

{
  size_type *psVar1;
  InternalRunDeathTestFlag *pIVar2;
  int iVar3;
  int iVar4;
  long *plVar5;
  undefined8 *puVar6;
  DeathTest *this_00;
  long *plVar7;
  ulong *puVar8;
  ulong uVar9;
  undefined8 uVar10;
  int death_test_index;
  int local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  ulong *local_e8;
  long local_e0;
  ulong local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  element_type *local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_a0;
  int local_94;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  UnitTest::GetInstance();
  pIVar2 = ((UnitTest::GetInstance::instance.impl_)->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  iVar3 = ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_;
  iVar4 = iVar3 + 1;
  ((UnitTest::GetInstance::instance.impl_)->current_test_info_->result_).death_test_count_ = iVar4;
  local_10c = iVar4;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    if (pIVar2->index_ <= iVar3) {
      StreamableToString<int>(&local_50,&local_10c);
      plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,0x1302d8);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_60 = *plVar7;
        lStack_58 = plVar5[3];
        local_70 = &local_60;
      }
      else {
        local_60 = *plVar7;
        local_70 = (long *)*plVar5;
      }
      local_68 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_70);
      puVar8 = (ulong *)(plVar5 + 2);
      if ((ulong *)*plVar5 == puVar8) {
        local_d8 = *puVar8;
        lStack_d0 = plVar5[3];
        local_e8 = &local_d8;
      }
      else {
        local_d8 = *puVar8;
        local_e8 = (ulong *)*plVar5;
      }
      local_e0 = plVar5[1];
      *plVar5 = (long)puVar8;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      local_94 = pIVar2->index_;
      StreamableToString<int>(&local_90,&local_94);
      uVar9 = 0xf;
      if (local_e8 != &local_d8) {
        uVar9 = local_d8;
      }
      if (uVar9 < local_90._M_string_length + local_e0) {
        uVar10 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          uVar10 = local_90.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar10 < local_90._M_string_length + local_e0) goto LAB_00121a40;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_e8);
      }
      else {
LAB_00121a40:
        puVar6 = (undefined8 *)
                 std::__cxx11::string::_M_append((char *)&local_e8,(ulong)local_90._M_dataplus._M_p)
        ;
      }
      local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
      psVar1 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108.field_2._8_8_ = puVar6[3];
      }
      else {
        local_108.field_2._M_allocated_capacity = *psVar1;
        local_108._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_108._M_string_length = puVar6[1];
      *puVar6 = psVar1;
      puVar6[1] = 0;
      *(undefined1 *)psVar1 = 0;
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_b8 = *plVar7;
        lStack_b0 = plVar5[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar7;
        local_c8 = (long *)*plVar5;
      }
      local_c0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_70 != &local_60) {
        operator_delete(local_70,local_60 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        return false;
      }
      goto LAB_00121c7b;
    }
    iVar3 = std::__cxx11::string::compare((char *)pIVar2);
    if (((iVar3 != 0) || (pIVar2->line_ != line)) || (pIVar2->index_ != iVar4)) {
      *test = (DeathTest *)0x0;
      return true;
    }
  }
  iVar4 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
  if (iVar4 == 0) {
    this_00 = (DeathTest *)operator_new(0x50);
    local_a8 = (matcher->
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               ).impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_a0 = (matcher->
                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ).impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[3]._vptr_DeathTest = (_func_int **)local_a8;
    this_00[4]._vptr_DeathTest = (_func_int **)p_Stack_a0;
    this_00[2]._vptr_DeathTest = (_func_int **)&PTR__MatcherBase_0013d8e0;
    *(undefined1 *)&this_00[5]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[6]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[7]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0013d718;
    this_00[8]._vptr_DeathTest = (_func_int **)file;
    *(int *)&this_00[9]._vptr_DeathTest = line;
  }
  else {
    iVar4 = std::__cxx11::string::compare(FLAGS_gtest_death_test_style_abi_cxx11_);
    if (iVar4 != 0) {
      std::operator+(&local_108,"Unknown death test style \"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     FLAGS_gtest_death_test_style_abi_cxx11_);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_108);
      plVar7 = plVar5 + 2;
      if ((long *)*plVar5 == plVar7) {
        local_b8 = *plVar7;
        lStack_b0 = plVar5[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar7;
        local_c8 = (long *)*plVar5;
      }
      local_c0 = plVar5[1];
      *plVar5 = (long)plVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      std::__cxx11::string::_M_assign((string *)&DeathTest::last_death_test_message__abi_cxx11_);
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      local_50.field_2._M_allocated_capacity = local_108.field_2._M_allocated_capacity;
      local_50._M_dataplus._M_p = local_108._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p == &local_108.field_2) {
        return false;
      }
LAB_00121c7b:
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      return false;
    }
    this_00 = (DeathTest *)operator_new(0x40);
    local_a8 = (matcher->
               super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
               ).impl_.
               super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
    p_Stack_a0 = (matcher->
                 super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                 ).impl_.
                 super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    (matcher->
    super_MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ).impl_.
    super___shared_ptr<const_testing::MatcherInterface<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    DeathTest::DeathTest(this_00);
    this_00[1]._vptr_DeathTest = (_func_int **)statement;
    this_00[3]._vptr_DeathTest = (_func_int **)local_a8;
    this_00[4]._vptr_DeathTest = (_func_int **)p_Stack_a0;
    this_00[2]._vptr_DeathTest = (_func_int **)&PTR__MatcherBase_0013d8e0;
    *(undefined1 *)&this_00[5]._vptr_DeathTest = 0;
    *(undefined8 *)((long)&this_00[5]._vptr_DeathTest + 4) = 0xffffffff;
    *(undefined8 *)((long)&this_00[6]._vptr_DeathTest + 4) = 0xffffffffffffffff;
    *(undefined4 *)((long)&this_00[7]._vptr_DeathTest + 4) = 0xffffffff;
    this_00->_vptr_DeathTest = (_func_int **)&PTR__DeathTestImpl_0013d6b8;
  }
  *test = this_00;
  return true;
}

Assistant:

bool DefaultDeathTestFactory::Create(const char* statement,
                                     Matcher<const std::string&> matcher,
                                     const char* file, int line,
                                     DeathTest** test) {
  UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const int death_test_index = impl->current_test_info()
      ->increment_death_test_count();

  if (flag != nullptr) {
    if (death_test_index > flag->index()) {
      DeathTest::set_last_death_test_message(
          "Death test count (" + StreamableToString(death_test_index)
          + ") somehow exceeded expected maximum ("
          + StreamableToString(flag->index()) + ")");
      return false;
    }

    if (!(flag->file() == file && flag->line() == line &&
          flag->index() == death_test_index)) {
      *test = nullptr;
      return true;
    }
  }

# if GTEST_OS_WINDOWS

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new WindowsDeathTest(statement, std::move(matcher), file, line);
  }

# elif GTEST_OS_FUCHSIA

  if (GTEST_FLAG(death_test_style) == "threadsafe" ||
      GTEST_FLAG(death_test_style) == "fast") {
    *test = new FuchsiaDeathTest(statement, std::move(matcher), file, line);
  }

# else

  if (GTEST_FLAG(death_test_style) == "threadsafe") {
    *test = new ExecDeathTest(statement, std::move(matcher), file, line);
  } else if (GTEST_FLAG(death_test_style) == "fast") {
    *test = new NoExecDeathTest(statement, std::move(matcher));
  }

# endif  // GTEST_OS_WINDOWS

  else {  // NOLINT - this is more readable than unbalanced brackets inside #if.
    DeathTest::set_last_death_test_message(
        "Unknown death test style \"" + GTEST_FLAG(death_test_style)
        + "\" encountered");
    return false;
  }